

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# progress.c
# Opt level: O1

_Bool progress_calc(Curl_easy *data,curltime now)

{
  int iVar1;
  ulong uVar2;
  long lVar3;
  undefined1 auVar4 [12];
  undefined8 uVar5;
  undefined4 uVar6;
  ulong uVar7;
  ulong uVar8;
  timediff_t tVar9;
  long lVar10;
  long lVar11;
  long lVar12;
  int iVar13;
  ulong uVar14;
  curltime newer;
  curltime newer_00;
  curltime older;
  curltime older_00;
  
  lVar12 = now.tv_sec;
  uVar5 = (data->progress).start.tv_sec;
  uVar6 = (data->progress).start.tv_usec;
  older.tv_usec = uVar6;
  older.tv_sec = uVar5;
  auVar4 = now._0_12_;
  newer._12_4_ = 0;
  newer.tv_sec = auVar4._0_8_;
  newer.tv_usec = auVar4._8_4_;
  older._12_4_ = 0;
  uVar7 = Curl_timediff_us(newer,older);
  (data->progress).timespent = uVar7;
  uVar14 = (data->progress).dl.cur_size;
  if ((long)uVar7 < 1) {
    uVar8 = uVar14 * 1000000;
  }
  else if ((long)uVar14 < 0x8637bd05af6) {
    uVar8 = (long)(uVar14 * 1000000) / (long)uVar7;
  }
  else if ((long)uVar7 < 1000000) {
    uVar8 = 0x7fffffffffffffff;
  }
  else {
    uVar8 = uVar14 / (uVar7 / 1000000);
  }
  (data->progress).dl.speed = uVar8;
  uVar2 = (data->progress).ul.cur_size;
  if ((long)uVar7 < 1) {
    uVar7 = uVar2 * 1000000;
  }
  else if ((long)uVar2 < 0x8637bd05af6) {
    uVar7 = (long)(uVar2 * 1000000) / (long)uVar7;
  }
  else if ((long)uVar7 < 1000000) {
    uVar7 = 0x7fffffffffffffff;
  }
  else {
    uVar7 = uVar2 / (uVar7 / 1000000);
  }
  (data->progress).ul.speed = uVar7;
  lVar3 = (data->progress).lastshow;
  if (lVar3 != lVar12) {
    iVar1 = (data->progress).speeder_c;
    iVar13 = iVar1 % 6;
    (data->progress).lastshow = lVar12;
    (data->progress).speeder[iVar13] = uVar2 + uVar14;
    (data->progress).speeder_time[iVar13].tv_sec = lVar12;
    (data->progress).speeder_time[iVar13].tv_usec = now.tv_usec;
    (data->progress).speeder_c = iVar1 + 1U;
    if (iVar1 == 0) {
      lVar11 = uVar7 + uVar8;
    }
    else {
      uVar14 = 0;
      if (4 < iVar1) {
        uVar14 = (ulong)((iVar1 + 1U) % 6);
      }
      uVar7 = (ulong)(uint)((int)uVar14 << 4);
      newer_00._12_4_ = 0;
      newer_00.tv_sec = auVar4._0_8_;
      newer_00.tv_usec = auVar4._8_4_;
      older_00.tv_usec = *(undefined4 *)((long)&(data->progress).speeder_time[0].tv_usec + uVar7);
      older_00.tv_sec = *(undefined8 *)((long)&(data->progress).speeder_time[0].tv_sec + uVar7);
      older_00._12_4_ = 0;
      tVar9 = Curl_timediff(newer_00,older_00);
      lVar11 = tVar9 + (ulong)(tVar9 == 0);
      lVar10 = (data->progress).speeder[iVar13] - (data->progress).speeder[uVar14];
      if (lVar10 < 0x418938) {
        lVar11 = (lVar10 * 1000) / lVar11;
      }
      else {
        lVar11 = (long)((double)lVar10 / ((double)lVar11 / 1000.0));
      }
    }
    (data->progress).current_speed = lVar11;
  }
  return lVar3 != lVar12;
}

Assistant:

static bool progress_calc(struct Curl_easy *data, struct curltime now)
{
  bool timetoshow = FALSE;
  struct Progress * const p = &data->progress;

  /* The time spent so far (from the start) in microseconds */
  p->timespent = Curl_timediff_us(now, p->start);
  p->dl.speed = trspeed(p->dl.cur_size, p->timespent);
  p->ul.speed = trspeed(p->ul.cur_size, p->timespent);

  /* Calculations done at most once a second, unless end is reached */
  if(p->lastshow != now.tv_sec) {
    int countindex; /* amount of seconds stored in the speeder array */
    int nowindex = p->speeder_c% CURR_TIME;
    p->lastshow = now.tv_sec;
    timetoshow = TRUE;

    /* Let's do the "current speed" thing, with the dl + ul speeds
       combined. Store the speed at entry 'nowindex'. */
    p->speeder[ nowindex ] = p->dl.cur_size + p->ul.cur_size;

    /* remember the exact time for this moment */
    p->speeder_time [ nowindex ] = now;

    /* advance our speeder_c counter, which is increased every time we get
       here and we expect it to never wrap as 2^32 is a lot of seconds! */
    p->speeder_c++;

    /* figure out how many index entries of data we have stored in our speeder
       array. With N_ENTRIES filled in, we have about N_ENTRIES-1 seconds of
       transfer. Imagine, after one second we have filled in two entries,
       after two seconds we have filled in three entries etc. */
    countindex = ((p->speeder_c >= CURR_TIME)? CURR_TIME:p->speeder_c) - 1;

    /* first of all, we do not do this if there is no counted seconds yet */
    if(countindex) {
      int checkindex;
      timediff_t span_ms;
      curl_off_t amount;

      /* Get the index position to compare with the 'nowindex' position.
         Get the oldest entry possible. While we have less than CURR_TIME
         entries, the first entry will remain the oldest. */
      checkindex = (p->speeder_c >= CURR_TIME)? p->speeder_c%CURR_TIME:0;

      /* Figure out the exact time for the time span */
      span_ms = Curl_timediff(now, p->speeder_time[checkindex]);
      if(0 == span_ms)
        span_ms = 1; /* at least one millisecond MUST have passed */

      /* Calculate the average speed the last 'span_ms' milliseconds */
      amount = p->speeder[nowindex]- p->speeder[checkindex];

      if(amount > CURL_OFF_T_C(4294967) /* 0xffffffff/1000 */)
        /* the 'amount' value is bigger than would fit in 32 bits if
           multiplied with 1000, so we use the double math for this */
        p->current_speed = (curl_off_t)
          ((double)amount/((double)span_ms/1000.0));
      else
        /* the 'amount' value is small enough to fit within 32 bits even
           when multiplied with 1000 */
        p->current_speed = amount*CURL_OFF_T_C(1000)/span_ms;
    }
    else
      /* the first second we use the average */
      p->current_speed = p->ul.speed + p->dl.speed;

  } /* Calculations end */
  return timetoshow;
}